

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_dumb.cpp
# Opt level: O2

MusInfo * MOD_OpenSong(FileReader *reader)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  IT_SAMPLE *pIVar9;
  void *pvVar10;
  int iVar11;
  BYTE *pBVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DUMBFILE *f;
  DUH *duh;
  DUMB_IT_SIGDATA *pDVar16;
  input_mod *this;
  ulong uVar17;
  char *pcVar18;
  sbyte sVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  byte bVar23;
  ushort uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  char cVar28;
  ulong uVar29;
  char cVar30;
  byte bVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  uint lenfull;
  uint uVar36;
  int iVar37;
  long lVar38;
  uint uVar39;
  uint local_f4;
  dumbfile_mem_status filestate;
  FString ver;
  anon_union_64_2_a0bbd727 anon_var_0;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (!mod_dumb.Value) {
    return (MusInfo *)0x0;
  }
  addterm(dumb_exit,"dumb_exit");
  lVar22 = reader->Length;
  iVar13 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[3])(reader);
  filestate.ptr = (BYTE *)&anon_var_0;
  filestate.offset = 0;
  lenfull = (uint)lVar22;
  uVar15 = 0x40;
  if ((int)lenfull < 0x40) {
    uVar15 = lenfull;
  }
  iVar14 = (*(reader->super_FileReaderBase)._vptr_FileReaderBase[2])
                     (reader,filestate.ptr,(long)(int)uVar15);
  if (CONCAT44(extraout_var_00,iVar14) != (long)(int)uVar15) {
    return (MusInfo *)0x0;
  }
  if (anon_var_0.dstart[0] == 0x4d504d49 && 3 < (int)lenfull) {
    f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
    if (f == (DUMBFILE *)0x0) goto LAB_003569c7;
    duh = dumb_read_it_quick(f);
    goto LAB_00356997;
  }
  if (((int)lenfull < 0x11) || (iVar14 = bcmp(&anon_var_0,"Extended Module: ",0x11), iVar14 != 0)) {
    if (anon_var_0.dstart[0xb] == 0x4d524353 && 0x2f < (int)lenfull) {
      f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
      if (f != (DUMBFILE *)0x0) {
        duh = dumb_read_s3m_quick(f);
        goto LAB_00356997;
      }
      goto LAB_003569c7;
    }
    cVar28 = (char)anon_var_0.dstart[0];
    cVar30 = (char)((uint)anon_var_0._0_4_ >> 8);
    if (((int)lenfull < 0x490) || (anon_var_0.start[0x1d] != '\x02')) {
      if (1 < (int)lenfull) goto LAB_00356704;
LAB_00356864:
      if (((anon_var_0.dstart[0] & 0xff0000) == 0x4d0000 && 2 < (int)lenfull) &&
          (cVar30 == 'T' && cVar28 == 'M')) {
        f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
        if (f != (DUMBFILE *)0x0) {
          duh = dumb_read_mtm_quick(f);
          goto LAB_00356997;
        }
      }
      else if ((anon_var_0.dstart[0] == 0x46464952 && 0xb < (int)lenfull) &&
              (((anon_var_0.dstart[2] == 0x20204d41 || (anon_var_0.dstart[2] == 0x464d5344)) ||
               (anon_var_0.dstart[2] == 0x46464d41)))) {
        f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
        if (f != (DUMBFILE *)0x0) {
          duh = dumb_read_riff_quick(f);
          goto LAB_00356997;
        }
      }
      else if ((((int)lenfull < 0x20) ||
               (iVar14 = bcmp(&anon_var_0,"ASYLUM Music Format",0x13), iVar14 != 0)) ||
              (iVar14 = bcmp(anon_var_0.start + 0x13," V1.0",5), iVar14 != 0)) {
        f = (DUMBFILE *)0x0;
        if ((((int)lenfull < 8) || (anon_var_0.dstart[0] != 0x41544b4f)) ||
           (f = (DUMBFILE *)0x0, anon_var_0.dstart[1] != 0x474e4f53)) goto LAB_003569c9;
        f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
        if (f != (DUMBFILE *)0x0) {
          duh = dumb_read_okt_quick(f);
          goto LAB_00356997;
        }
      }
      else {
        f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
        if (f != (DUMBFILE *)0x0) {
          duh = dumb_read_asy_quick(f);
          goto LAB_00356997;
        }
      }
      goto LAB_003569c7;
    }
    if (((anon_var_0._20_8_ == 0x216d616572635321) || (anon_var_0._20_8_ == 0x4d545332444f4d42)) ||
       (anon_var_0._20_8_ == 0x21444f4d415a5557)) {
      f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
      if (f != (DUMBFILE *)0x0) {
        duh = dumb_read_stm_quick(f);
        goto LAB_00356997;
      }
      goto LAB_003569c7;
    }
LAB_00356704:
    if ((cVar30 != 'f' || cVar28 != 'i') && (cVar30 != 'N' || cVar28 != 'J')) {
      if (anon_var_0.dstart[0xb] == 0x464d5450 && 0x2f < (int)lenfull) {
        f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
        if (f != (DUMBFILE *)0x0) {
          duh = dumb_read_ptm_quick(f);
          goto LAB_00356997;
        }
      }
      else if (anon_var_0.dstart[0] == 0x204d5350 && 3 < (int)lenfull) {
        f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
        if (f != (DUMBFILE *)0x0) {
          duh = dumb_read_psm_quick(f,0);
          goto LAB_00356997;
        }
      }
      else {
        if (anon_var_0.dstart[0] != 0xfe4d5350 || (int)lenfull < 4) goto LAB_00356864;
        f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
        if (f != (DUMBFILE *)0x0) {
          duh = dumb_read_old_psm_quick(f);
          goto LAB_00356997;
        }
      }
      goto LAB_003569c7;
    }
    f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
    if (f == (DUMBFILE *)0x0) goto LAB_003569c7;
    duh = dumb_read_669_quick(f);
LAB_00356997:
    if (duh == (DUH *)0x0) goto LAB_003569c9;
  }
  else {
    f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
    if (f != (DUMBFILE *)0x0) {
      duh = dumb_read_xm_quick(f);
      goto LAB_00356997;
    }
LAB_003569c7:
    f = (DUMBFILE *)0x0;
LAB_003569c9:
    if ((anon_union_64_2_a0bbd727 *)filestate.ptr == &anon_var_0) {
      f = dumb_read_allfile(&filestate,anon_var_0.start,reader,uVar15,lenfull);
      if (f == (DUMBFILE *)0x0) {
        (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])
                  (reader,CONCAT44(extraout_var,iVar13),0);
        return (MusInfo *)0x0;
      }
    }
    else {
      filestate.offset = 0;
    }
    duh = dumb_read_mod_quick(f,1);
    if (f == (DUMBFILE *)0x0) goto LAB_00356a1f;
  }
  dumbfile_close(f);
LAB_00356a1f:
  iVar11 = mod_autochip_size_scan.Value;
  iVar14 = mod_autochip_size_force.Value;
  if (duh == (DUH *)0x0) {
    this = (input_mod *)0x0;
    (*(reader->super_FileReaderBase)._vptr_FileReaderBase[4])
              (reader,CONCAT44(extraout_var,iVar13),0);
  }
  else {
    if (mod_autochip.Value == true) {
      uVar15 = mod_autochip_scan_threshold.Value << 8;
      uVar20 = mod_autochip_scan_threshold.Value << 0x10;
      pDVar16 = duh_get_it_sigdata(duh);
      if (pDVar16 != (DUMB_IT_SIGDATA *)0x0) {
        uVar29 = 0;
        uVar17 = (ulong)(uint)pDVar16->n_samples;
        if (pDVar16->n_samples < 1) {
          uVar17 = uVar29;
        }
        for (; uVar29 != uVar17; uVar29 = uVar29 + 1) {
          pIVar9 = pDVar16->sample;
          bVar3 = pIVar9[uVar29].flags;
          if ((bVar3 & 1) != 0) {
            uVar33 = bVar3 & 4;
            iVar13 = pIVar9[uVar29].length;
            if (iVar13 < iVar14) goto LAB_00356acd;
            if (iVar13 < iVar11) {
              uVar32 = ((bVar3 & 4) != 0) + 1;
              uVar35 = (ulong)uVar32;
              uVar27 = (uint)((long)(CONCAT44((int)(uVar15 | 0x32) >> 0x1f,uVar15) | 0x32) / 100);
              uVar39 = (uint)((long)(CONCAT44((int)(uVar20 | 0x32) >> 0x1f,uVar20) | 0x32) / 100);
              if ((bVar3 & 0x50) != 0x10) goto LAB_00356bbe;
              sVar19 = (sbyte)(uVar33 >> 2);
              uVar36 = pIVar9[uVar29].loop_start << sVar19;
              iVar25 = pIVar9[uVar29].loop_end << sVar19;
              pvVar10 = pIVar9[uVar29].data;
              lVar22 = (long)(int)uVar36;
              if ((bVar3 & 2) == 0) {
                uVar26 = (int)*(char *)((long)pvVar10 + lVar22) -
                         (int)*(char *)((long)pvVar10 + (long)(int)(iVar25 - uVar32));
                uVar36 = -uVar26;
                if (0 < (int)uVar26) {
                  uVar36 = uVar26;
                }
                if ((int)(uVar36 & 0xff) <= (int)uVar27) {
                  if ((bVar3 & 4) != 0) {
                    uVar26 = (int)*(char *)((long)pvVar10 + lVar22 + 1) -
                             (int)*(char *)((long)pvVar10 + (long)iVar25 + -1);
                    uVar36 = -uVar26;
                    if (0 < (int)uVar26) {
                      uVar36 = uVar26;
                    }
                    if (uVar27 < (uVar36 & 0xff)) goto LAB_00356acd;
                  }
LAB_00356bbe:
                  if ((bVar3 & 0xa0) == 0x20) {
                    sVar19 = (sbyte)(uVar33 >> 2);
                    uVar33 = pIVar9[uVar29].sus_loop_start << sVar19;
                    iVar25 = pIVar9[uVar29].sus_loop_end << sVar19;
                    pvVar10 = pIVar9[uVar29].data;
                    lVar22 = (long)(int)uVar33;
                    if ((bVar3 & 2) == 0) {
                      iVar37 = (int)*(char *)((long)pvVar10 + lVar22) -
                               (int)*(char *)((long)pvVar10 + (long)(int)(iVar25 - uVar32));
                      bVar31 = (byte)iVar37;
                      bVar23 = -bVar31;
                      if (0 < iVar37) {
                        bVar23 = bVar31;
                      }
                      if ((int)(uint)bVar23 <= (int)uVar27) {
                        if ((bVar3 & 4) == 0) {
LAB_00356d13:
                          sVar19 = 0;
                          goto LAB_00356c5a;
                        }
                        uVar32 = (int)*(char *)((long)pvVar10 + lVar22 + 1) -
                                 (int)*(char *)((long)pvVar10 + (long)iVar25 + -1);
                        uVar33 = -uVar32;
                        if (0 < (int)uVar32) {
                          uVar33 = uVar32;
                        }
                        if ((uVar33 & 0xff) <= uVar27) goto LAB_00356c5a;
                      }
                    }
                    else {
                      iVar37 = (int)*(short *)((long)pvVar10 + lVar22 * 2) -
                               (int)*(short *)((long)pvVar10 + (long)(int)(iVar25 - uVar32) * 2);
                      uVar4 = (ushort)iVar37;
                      uVar24 = -uVar4;
                      if (0 < iVar37) {
                        uVar24 = uVar4;
                      }
                      if ((int)(uint)uVar24 <= (int)uVar39) {
                        if ((bVar3 & 4) == 0) goto LAB_00356d13;
                        uVar32 = (int)*(short *)((long)pvVar10 + (long)(int)(uVar33 | 1) * 2) -
                                 (int)*(short *)((long)pvVar10 + (long)iVar25 * 2 + -2);
                        uVar33 = -uVar32;
                        if (0 < (int)uVar32) {
                          uVar33 = uVar32;
                        }
                        if ((uVar33 & 0xffff) <= uVar39) goto LAB_00356c5a;
                      }
                    }
                  }
                  else {
                    sVar19 = (sbyte)(uVar33 >> 2);
LAB_00356c5a:
                    if ((bVar3 & 0x10) != 0) {
                      iVar13 = pIVar9[uVar29].loop_end;
                    }
                    lVar22 = (long)(iVar13 << sVar19);
                    lVar38 = 0;
                    uVar34 = uVar35;
                    if ((bVar3 & 2) == 0) {
                      for (; (long)uVar34 < lVar22; uVar34 = uVar34 + uVar35) {
                        iVar25 = (int)*(char *)((long)pIVar9[uVar29].data + lVar38) -
                                 (int)*(char *)((long)pIVar9[uVar29].data + uVar34);
                        bVar31 = (byte)iVar25;
                        bVar23 = -bVar31;
                        if (0 < iVar25) {
                          bVar23 = bVar31;
                        }
                        if ((int)uVar27 < (int)(uint)bVar23) goto LAB_00356acd;
                        lVar38 = lVar38 + uVar35;
                      }
                      if ((bVar3 & 4) != 0) {
                        for (uVar34 = 3; (long)uVar34 < lVar22; uVar34 = uVar34 + 2) {
                          iVar25 = (int)*(char *)((long)pIVar9[uVar29].data + (uVar34 - 2)) -
                                   (int)*(char *)((long)pIVar9[uVar29].data + uVar34);
                          bVar3 = (byte)iVar25;
                          bVar31 = -bVar3;
                          if (0 < iVar25) {
                            bVar31 = bVar3;
                          }
                          if ((int)uVar27 < (int)(uint)bVar31) break;
                        }
                      }
                    }
                    else {
                      for (; (long)uVar34 < lVar22; uVar34 = uVar34 + uVar35) {
                        iVar25 = (int)*(short *)((long)pIVar9[uVar29].data + lVar38 * 2) -
                                 (int)*(short *)((long)pIVar9[uVar29].data + uVar34 * 2);
                        uVar4 = (ushort)iVar25;
                        uVar24 = -uVar4;
                        if (0 < iVar25) {
                          uVar24 = uVar4;
                        }
                        if ((int)uVar39 < (int)(uint)uVar24) goto LAB_00356acd;
                        lVar38 = lVar38 + uVar35;
                      }
                      if ((bVar3 & 4) != 0) {
                        for (uVar34 = 3; (long)uVar34 < lVar22; uVar34 = uVar34 + 2) {
                          iVar25 = (int)*(short *)((long)pIVar9[uVar29].data + uVar34 * 2 + -4) -
                                   (int)*(short *)((long)pIVar9[uVar29].data + uVar34 * 2);
                          uVar4 = (ushort)iVar25;
                          uVar24 = -uVar4;
                          if (0 < iVar25) {
                            uVar24 = uVar4;
                          }
                          if ((int)uVar39 < (int)(uint)uVar24) break;
                        }
                      }
                    }
                    if (iVar13 << sVar19 <= (int)uVar34) goto LAB_00356d5f;
                  }
                }
              }
              else {
                uVar21 = (int)*(short *)((long)pvVar10 + lVar22 * 2) -
                         (int)*(short *)((long)pvVar10 + (long)(int)(iVar25 - uVar32) * 2);
                uVar26 = -uVar21;
                if (0 < (int)uVar21) {
                  uVar26 = uVar21;
                }
                if ((int)(uVar26 & 0xffff) <= (int)uVar39) {
                  if ((bVar3 & 4) != 0) {
                    uVar26 = (int)*(short *)((long)pvVar10 + (long)(int)(uVar36 | 1) * 2) -
                             (int)*(short *)((long)pvVar10 + (long)iVar25 * 2 + -2);
                    uVar36 = -uVar26;
                    if (0 < (int)uVar26) {
                      uVar36 = uVar26;
                    }
                    if (uVar39 < (uVar36 & 0xffff)) goto LAB_00356acd;
                  }
                  goto LAB_00356bbe;
                }
              }
LAB_00356acd:
              pIVar9[uVar29].max_resampling_quality = 0;
            }
          }
LAB_00356d5f:
        }
      }
    }
    this = (input_mod *)operator_new(0x88);
    input_mod::input_mod(this,duh);
    iVar13 = (*(this->super_StreamSong).super_MusInfo._vptr_MusInfo[10])(this);
    pBVar12 = filestate.ptr;
    if ((char)iVar13 == '\0') {
      (*(this->super_StreamSong).super_MusInfo._vptr_MusInfo[1])(this);
      this = (input_mod *)0x0;
    }
    else if (anon_var_0.dstart[0] == 0x4d504d49 && 3 < (int)lenfull) {
      if (((0xff < lenfull && filestate.ptr != (BYTE *)0x0) && (*(int *)filestate.ptr == 0x4d504d49)
          ) && ((*(ushort *)(filestate.ptr + 0x22) < 0x100 &&
                (((0xf05f < (ushort)(*(ushort *)(filestate.ptr + 0x24) - 0xfa1) &&
                  (*(ushort *)(filestate.ptr + 0x20) != 0)) &&
                 ((uint)*(ushort *)(filestate.ptr + 0x20) +
                  ((uint)*(ushort *)(filestate.ptr + 0x24) + (uint)*(ushort *)(filestate.ptr + 0x22)
                  & 0x3fff) * 4 + (uint)*(ushort *)(filestate.ptr + 0x26) * 4 + 0xc0 <=
                  (lenfull & 0x7fffffff))))))) {
        ver.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        FString::Format(&ver,"IT v%u.%02x",(ulong)(*(ushort *)(filestate.ptr + 0x2a) >> 8),
                        (ulong)*(ushort *)(filestate.ptr + 0x2a) & 0xff);
        FString::operator=(&this->Codec,&ver);
        FString::Format(&ver,"%u.%02x",(ulong)(*(ushort *)(pBVar12 + 0x28) >> 8),
                        (ulong)*(ushort *)(pBVar12 + 0x28) & 0xff);
        FString::operator=(&this->TrackerVersion,&ver);
        uVar4 = *(ushort *)(pBVar12 + 0x20);
        uVar24 = *(ushort *)(pBVar12 + 0x22);
        uVar5 = *(ushort *)(pBVar12 + 0x24);
        uVar6 = *(ushort *)(pBVar12 + 0x26);
        uVar17 = (ulong)((uint)uVar4 + (uint)uVar6 * 4) + (ulong)((uint)uVar5 + (uint)uVar24) * 4 +
                 0xc0;
        uVar15 = (uint)uVar17;
        if (uVar15 < lenfull) {
          uVar20 = uVar15 + (uint)*(ushort *)(pBVar12 + uVar17) * 8 + 2;
          uVar17 = (ulong)(uVar15 + 2);
          if (uVar20 < lenfull) {
            uVar17 = (ulong)uVar20;
          }
        }
        uVar29 = uVar17 + 0x1320;
        if ((ulong)(lenfull & 0x7fffffff) <= uVar17 + 0x1320) {
          uVar29 = uVar17;
        }
        if ((pBVar12[0x2c] & 0x80) == 0) {
          uVar29 = uVar17;
        }
        uVar15 = (int)uVar29 + 8;
        if ((uVar15 < lenfull) && (*(int *)(pBVar12 + uVar29) == 0x4d414e50)) {
          uVar20 = *(int *)(pBVar12 + uVar29 + 4) + uVar15;
          uVar33 = uVar15;
          if (*(int *)(pBVar12 + uVar29 + 4) - 0x20U < 0x1de1) {
            uVar33 = uVar20;
          }
          if (lenfull < uVar20) {
            uVar33 = uVar15;
          }
          uVar29 = (ulong)uVar33;
          uVar15 = uVar33 + 8;
        }
        local_f4 = 0;
        if ((uVar15 < lenfull) && (*(int *)(pBVar12 + uVar29) == 0x4d414e43)) {
          uVar20 = *(uint *)(pBVar12 + uVar29 + 4);
          local_f4 = uVar20 / 0x14;
          if (0x4ec < uVar20 - 0x14) {
            local_f4 = 0;
          }
          if (lenfull < uVar15 + uVar20) {
            local_f4 = 0;
          }
        }
        for (uVar17 = 0; uVar17 != uVar6; uVar17 = uVar17 + 1) {
          local_48 = (undefined1  [16])0x0;
          local_58 = (undefined1  [16])0x0;
          local_68 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          uVar15 = *(uint *)(pBVar12 +
                            uVar17 * 4 + (ulong)uVar5 * 4 + (ulong)uVar24 * 4 + (ulong)uVar4 + 0xc0)
          ;
          uVar29 = (ulong)uVar15;
          if (((uVar15 + 4 < lenfull && uVar29 != 0) &&
              (uVar7 = *(ushort *)(pBVar12 + uVar29 + 2), 0xff02 < (ushort)(uVar7 - 0x101))) &&
             (uVar8 = *(ushort *)(pBVar12 + uVar29), uVar15 + uVar8 + 8 <= lenfull)) {
            uVar15 = 0;
            uVar20 = 0;
            do {
              uVar35 = (ulong)uVar15;
              while( true ) {
                if ((uVar7 <= uVar20) || ((uint)uVar8 <= uVar35)) goto LAB_00357059;
                bVar3 = pBVar12[uVar35 + uVar29 + 8];
                if (bVar3 != 0) break;
                uVar20 = uVar20 + 1;
                uVar35 = uVar35 + 1;
              }
              uVar15 = (uint)(uVar35 + 1);
              uVar33 = bVar3 - 1 & 0x3f;
              if ((bVar3 & 0x7f) == 0) {
                uVar33 = bVar3 & 0x7f;
              }
              if ((char)bVar3 < '\0') {
                if (uVar8 <= uVar15) break;
                uVar15 = (int)uVar35 + 2;
                bVar3 = pBVar12[(uVar35 + 1 & 0xffffffff) + uVar29 + 8];
                local_78[uVar33] = bVar3;
              }
              else {
                bVar3 = local_78[uVar33];
              }
              uVar27 = uVar33 + 1;
              if (uVar33 < local_f4) {
                uVar27 = local_f4;
              }
              if ((bVar3 & 0xf) != 0) {
                local_f4 = uVar27;
              }
              uVar15 = (uint)(bVar3 >> 2 & 2) +
                       (uint)(bVar3 >> 1 & 1) + (bVar3 & 1) + uVar15 + (uint)((bVar3 >> 2 & 1) != 0)
              ;
            } while (uVar15 < uVar8);
          }
LAB_00357059:
        }
        this->NumChannels = local_f4;
        this->NumPatterns = (uint)uVar6;
        this->NumOrders = (uint)uVar4;
        FString::~FString(&ver);
      }
    }
    else {
      pDVar16 = duh_get_it_sigdata(duh);
      if (pDVar16 != (DUMB_IT_SIGDATA *)0x0) {
        uVar1 = pDVar16->n_patterns;
        uVar2 = pDVar16->n_pchannels;
        this->NumChannels = uVar2;
        this->NumPatterns = uVar1;
        this->NumOrders = pDVar16->n_orders;
        pcVar18 = duh_get_tag(duh,"FORMAT");
        FString::operator=(&this->Codec,pcVar18);
        pcVar18 = duh_get_tag(duh,"TRACKERVERSION");
        FString::operator=(&this->TrackerVersion,pcVar18);
        pcVar18 = duh_get_tag(duh,"FORMATVERSION");
        FString::operator=(&this->FormatVersion,pcVar18);
      }
    }
  }
  if (filestate.ptr != (BYTE *)0x0 && (anon_union_64_2_a0bbd727 *)filestate.ptr != &anon_var_0) {
    operator_delete__(filestate.ptr);
    return (MusInfo *)this;
  }
  return (MusInfo *)this;
}

Assistant:

MusInfo *MOD_OpenSong(FileReader &reader)
{
	DUH *duh = 0;
	int headsize;
	union
	{
		BYTE start[64];
		DWORD dstart[64/4];
	};
	dumbfile_mem_status filestate;
	DUMBFILE *f = NULL;
	long fpos = 0;
	input_mod *state = NULL;

	if (!mod_dumb)
	{
		return NULL;
	}

	bool is_it = false;
	bool is_dos = true;

	atterm(dumb_exit);

    int size = reader.GetLength();
    fpos = reader.Tell();

	filestate.ptr = start;
	filestate.offset = 0;
	headsize = MIN((int)sizeof(start), size);

    if (headsize != reader.Read(start, headsize))
    {
        return NULL;
    }

	if (size >= 4 && dstart[0] == MAKE_ID('I','M','P','M'))
	{
		is_it = true;
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_it_quick(f);
		}
	}
	else if (size >= 17 && !memcmp(start, "Extended Module: ", 17))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_xm_quick(f);
		}
	}
	else if (size >= 0x30 && dstart[11] == MAKE_ID('S','C','R','M'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_s3m_quick(f);
		}
	}
	else if (size >= 1168 &&
		/*start[28] == 0x1A &&*/ start[29] == 2 &&
		( !memcmp( &start[20], "!Scream!", 8 ) ||
		  !memcmp( &start[20], "BMOD2STM", 8 ) ||
		  !memcmp( &start[20], "WUZAMOD!", 8 ) ) )
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_stm_quick(f);
		}
	}
	else if (size >= 2 &&
		((start[0] == 0x69 && start[1] == 0x66) ||
		 (start[0] == 0x4A && start[1] == 0x4E)))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_669_quick(f);
		}
	}
	else if (size >= 0x30 && dstart[11] == MAKE_ID('P','T','M','F'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_ptm_quick(f);
		}
	}
	else if (size >= 4 && dstart[0] == MAKE_ID('P','S','M',' '))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_psm_quick(f, 0/*start_order*/);
			/*start_order = 0;*/
		}
	}
	else if (size >= 4 && dstart[0] == (DWORD)MAKE_ID('P','S','M',254))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_old_psm_quick(f);
		}
	}
	else if (size >= 3 && start[0] == 'M' && start[1] == 'T' && start[2] == 'M')
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_mtm_quick(f);
		}
	}
	else if (size >= 12 && dstart[0] == MAKE_ID('R','I','F','F') &&
		(dstart[2] == MAKE_ID('D','S','M','F') ||
		 dstart[2] == MAKE_ID('A','M',' ',' ') ||
		 dstart[2] == MAKE_ID('A','M','F','F')))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_riff_quick(f);
		}
	}
	else if (size >= 32 &&
		!memcmp( start, "ASYLUM Music Format", 19 ) &&
		!memcmp( start + 19, " V1.0", 5 ) )
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_asy_quick(f);
		}
	}
	else if (size >= 8 &&
		dstart[0] == MAKE_ID('O','K','T','A') &&
		dstart[1] == MAKE_ID('S','O','N','G'))
	{
		if ((f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
		{
			duh = dumb_read_okt_quick(f);
		}
	}

	if ( ! duh )
	{
		is_dos = false;
		if (filestate.ptr == (BYTE *)start)
		{
			if (!(f = dumb_read_allfile(&filestate, start, reader, headsize, size)))
			{
                reader.Seek(fpos, SEEK_SET);
				return NULL;
			}
		}
		else
		{
			filestate.offset = 0;
		}
		// No way to get the filename, so we can't check for a .mod extension, and
		// therefore, trying to load an old 15-instrument SoundTracker module is not
		// safe. We'll restrict MOD loading to 31-instrument modules with known
		// signatures and let the sound system worry about 15-instrument ones.
		// (Assuming it even supports them)
		duh = dumb_read_mod_quick(f, TRUE);
	}

	if (f != NULL)
	{
		dumbfile_close(f);
	}
	if ( duh )
	{
		if (mod_autochip)
		{
			MOD_SetAutoChip(duh);
		}
		state = new input_mod(duh);
		if (!state->IsValid())
		{
			delete state;
			state = NULL;
		}
		else
		{
			if (is_it) ReadIT(filestate.ptr, size, state, false);
			else ReadDUH(duh, state, false, is_dos);
		}
	}
	else
	{
		// Reposition file pointer for other codecs to do their checks.
        reader.Seek(fpos, SEEK_SET);
	}
	if (filestate.ptr != (BYTE *)start)
	{
		delete[] const_cast<BYTE *>(filestate.ptr);
	}
	return state;
}